

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::BufferGLImpl::MapRange
          (BufferGLImpl *this,GLContextState *CtxState,MAP_TYPE MapType,Uint32 MapFlags,
          Uint64 Offset,Uint64 Length,PVoid *pMappedData)

{
  void *pvVar1;
  undefined7 in_register_00000011;
  GLbitfield GVar2;
  GLenum err;
  string msg;
  
  GVar2 = (GLbitfield)CONCAT71(in_register_00000011,MapType);
  BufferMemoryBarrier(this,MEMORY_BARRIER_CLIENT_MAPPED_BUFFER,CtxState);
  GLContextState::BindBuffer(CtxState,this->m_BindTarget,&this->m_GlBuffer,true);
  if (GVar2 != 1) {
    if (GVar2 == 3) {
      GVar2 = 3;
    }
    else if (GVar2 == 2) {
      GVar2 = (MapFlags & 4) * 8 + (MapFlags & 2) * 4 + 2;
    }
    else {
      FormatString<char[17]>(&msg,(char (*) [17])"Unknown map type");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"MapRange",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
                 ,0x172);
      std::__cxx11::string::~string((string *)&msg);
      GVar2 = 0;
    }
  }
  pvVar1 = (*__glewMapBufferRange)(this->m_BindTarget,Offset,Length,GVar2);
  *pMappedData = pvVar1;
  err = glGetError();
  if (err != 0) {
    LogError<false,char[26],char[17],unsigned_int>
              (false,"MapRange",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0x176,(char (*) [26])"glMapBufferRange() failed",(char (*) [17])"\nGL Error Code: ",
               &err);
    FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"MapRange",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0x176);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (*pMappedData == (PVoid)0x0) {
    FormatString<char[11]>(&msg,(char (*) [11])"Map failed");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"MapRange",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0x177);
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

void BufferGLImpl::MapRange(GLContextState& CtxState, MAP_TYPE MapType, Uint32 MapFlags, Uint64 Offset, Uint64 Length, PVoid& pMappedData)
{
    BufferMemoryBarrier(
        MEMORY_BARRIER_CLIENT_MAPPED_BUFFER, // Access by the client to persistent mapped regions of buffer
                                             // objects will reflect data written by shaders prior to the barrier.
                                             // Note that this may cause additional synchronization operations.
        CtxState);

    // We must unbind VAO because otherwise we will break the bindings
    constexpr bool ResetVAO = true;
    CtxState.BindBuffer(m_BindTarget, m_GlBuffer, ResetVAO);

    // !!!WARNING!!! GL_MAP_UNSYNCHRONIZED_BIT is not the same thing as MAP_FLAG_DO_NOT_WAIT.
    // If GL_MAP_UNSYNCHRONIZED_BIT flag is set, OpenGL will not attempt to synchronize operations
    // on the buffer. This does not mean that map will fail if the buffer still in use. It is thus
    // what WRITE_NO_OVERWRITE does

    GLbitfield Access = 0;
    switch (MapType)
    {
        case MAP_READ:
            Access |= GL_MAP_READ_BIT;
            break;

        case MAP_WRITE:
            Access |= GL_MAP_WRITE_BIT;

            if (MapFlags & MAP_FLAG_DISCARD)
            {
                // Use GL_MAP_INVALIDATE_BUFFER_BIT flag to discard previous buffer contents

                // If GL_MAP_INVALIDATE_BUFFER_BIT is specified, the entire contents of the buffer may
                // be discarded and considered invalid, regardless of the specified range. Any data
                // lying outside the mapped range of the buffer object becomes undefined, as does any
                // data within the range but not subsequently written by the application.This flag may
                // not be used with GL_MAP_READ_BIT.
                Access |= GL_MAP_INVALIDATE_BUFFER_BIT;
            }

            if (MapFlags & MAP_FLAG_NO_OVERWRITE)
            {
                // If GL_MAP_UNSYNCHRONIZED_BIT flag is set, OpenGL will not attempt to synchronize
                // operations on the buffer.
                Access |= GL_MAP_UNSYNCHRONIZED_BIT;
            }
            break;


        case MAP_READ_WRITE:
            Access |= GL_MAP_WRITE_BIT | GL_MAP_READ_BIT;
            break;


        default: UNEXPECTED("Unknown map type");
    }

    pMappedData = glMapBufferRange(m_BindTarget, StaticCast<GLintptr>(Offset), StaticCast<GLsizeiptr>(Length), Access);
    DEV_CHECK_GL_ERROR("glMapBufferRange() failed");
    VERIFY(pMappedData, "Map failed");
}